

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

void LexOctal(SQChar *s,SQUnsignedInteger *res)

{
  SQUnsignedInteger SVar1;
  char cVar2;
  char *pcVar3;
  
  *res = 0;
  cVar2 = *s;
  if (cVar2 != '\0') {
    pcVar3 = s + 1;
    SVar1 = 0;
    do {
      if (((long)cVar2 & 0xfffffffffffffff8U) != 0x30) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqlexer.cpp"
                      ,0x1d8,"void LexOctal(const SQChar *, SQUnsignedInteger *)");
      }
      SVar1 = ((long)cVar2 + SVar1 * 8) - 0x30;
      *res = SVar1;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void LexOctal(const SQChar *s,SQUnsignedInteger *res)
{
    *res = 0;
    while(*s != 0)
    {
        if(scisodigit(*s)) *res = (*res)*8+((*s++)-'0');
        else { assert(0); }
    }
}